

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsysinfo.cpp
# Opt level: O1

QString * QSysInfo::prettyProductName(void)

{
  Data *pDVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  storage_type *in_RCX;
  char *pcVar7;
  QString *in_RDI;
  long in_FS_OFFSET;
  QByteArrayView ba;
  QByteArrayView ba_00;
  QUnixOSVersion unixOsVersion;
  utsname u;
  QString local_268;
  QString local_250;
  QUnixOSVersion local_238;
  QStringBuilder<QStringBuilder<QString,_char16_t>,_QString> local_1f0;
  utsname local_1b6;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_238.productType.d.d = (Data *)0x0;
  local_238.productType.d.ptr = (char16_t *)0x0;
  local_238.productType.d.size = 0;
  local_238.productVersion.d.d = (Data *)0x0;
  local_238.productVersion.d.ptr = (char16_t *)0x0;
  local_238.productVersion.d.size = 0;
  local_238.prettyName.d.d = (Data *)0x0;
  local_238.prettyName.d.ptr = (char16_t *)0x0;
  local_238.prettyName.d.size = 0;
  findUnixOsVersion(&local_238);
  if (local_238.prettyName.d.size == 0) {
    memset(&local_1b6,0xaa,0x186);
    iVar4 = uname(&local_1b6);
    if (iVar4 == 0) {
      pcVar5 = (char *)memchr(&local_1b6,0,0x41);
      pcVar7 = local_1b6.nodename;
      if (pcVar5 != (char *)0x0) {
        pcVar7 = pcVar5;
      }
      ba.m_data = in_RCX;
      ba.m_size = (qsizetype)&local_1b6;
      QString::fromLatin1(&local_250,(QString *)(pcVar7 + -(long)&local_1b6),ba);
      qVar3 = local_250.d.size;
      pcVar2 = local_250.d.ptr;
      pDVar1 = local_250.d.d;
      local_250.d.d = (Data *)0x0;
      local_250.d.ptr = (char16_t *)0x0;
      local_250.d.size = 0;
      pcVar7 = local_1b6.release;
      pcVar6 = (char *)memchr(pcVar7,0,0x41);
      pcVar5 = local_1b6.version;
      if (pcVar6 != (char *)0x0) {
        pcVar5 = pcVar6;
      }
      ba_00.m_data = in_RCX;
      ba_00.m_size = (qsizetype)pcVar7;
      QString::fromLatin1(&local_268,(QString *)(pcVar5 + -(long)pcVar7),ba_00);
      local_1f0.b.d.size = local_268.d.size;
      local_1f0.b.d.ptr = local_268.d.ptr;
      local_1f0.b.d.d = local_268.d.d;
      local_1f0.a.a.d.d = pDVar1;
      local_1f0.a.a.d.ptr = pcVar2;
      local_1f0.a.a.d.size = qVar3;
      local_1f0.a.b = L' ';
      local_268.d.d = (Data *)0x0;
      local_268.d.ptr = (char16_t *)0x0;
      local_268.d.size = 0;
      QStringBuilder<QStringBuilder<QString,_char16_t>,_QString>::convertTo<QString>
                (in_RDI,&local_1f0);
      QStringBuilder<QStringBuilder<QString,_char16_t>,_QString>::~QStringBuilder(&local_1f0);
      if (&(local_268.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_268.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_268.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_268.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_268.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_250.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_250.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_250.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_250.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_250.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
    else {
      (in_RDI->d).d = (Data *)0x0;
      (in_RDI->d).ptr = L"unknown";
      (in_RDI->d).size = 7;
    }
  }
  else {
    (in_RDI->d).d = local_238.prettyName.d.d;
    (in_RDI->d).ptr = local_238.prettyName.d.ptr;
    (in_RDI->d).size = local_238.prettyName.d.size;
    if (&(local_238.prettyName.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_238.prettyName.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_238.prettyName.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
           _M_i + 1;
      UNLOCK();
    }
  }
  if (&(local_238.prettyName.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_238.prettyName.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_238.prettyName.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
         + -1;
    UNLOCK();
    if (((local_238.prettyName.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
        == 0) {
      QArrayData::deallocate(&(local_238.prettyName.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_238.productVersion.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_238.productVersion.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_238.productVersion.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
         _M_i + -1;
    UNLOCK();
    if (((local_238.productVersion.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
        _M_i == 0) {
      QArrayData::deallocate(&(local_238.productVersion.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_238.productType.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_238.productType.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_238.productType.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
         + -1;
    UNLOCK();
    if (((local_238.productType.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
        == 0) {
      QArrayData::deallocate(&(local_238.productType.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QString QSysInfo::prettyProductName()
{
#if defined(Q_OS_ANDROID) || defined(Q_OS_DARWIN) || defined(Q_OS_WIN)
    const auto version = QOperatingSystemVersion::current();
    const int majorVersion = version.majorVersion();
    const QString versionString = QString::asprintf("%d.%d", majorVersion, version.minorVersion());
    QString result = version.name() + u' ';
    const char *name = osVer_helper(version);
    if (!name)
        return result + versionString;
    result += QLatin1StringView(name);
#  if !defined(Q_OS_WIN)
    return result + " ("_L1 + versionString + u')';
#  else
    // (resembling winver.exe): Windows 10 "Windows 10 Version 1809"
    const auto displayVersion = windowsDisplayVersion();
    if (!displayVersion.isEmpty())
        result += " Version "_L1 + displayVersion;
    return result;
#  endif // Windows
#elif defined(Q_OS_HAIKU)
    return "Haiku "_L1 + productVersion();
#elif defined(Q_OS_UNIX)
#  ifdef USE_ETC_OS_RELEASE
    QUnixOSVersion unixOsVersion;
    findUnixOsVersion(unixOsVersion);
    if (!unixOsVersion.prettyName.isEmpty())
        return unixOsVersion.prettyName;
#  endif
    struct utsname u;
    if (uname(&u) == 0)
        return QString::fromLatin1(u.sysname) + u' ' + QString::fromLatin1(u.release);
#endif
    return unknownText();
}